

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O2

void uv__stream_flush_write_queue(uv_stream_t *stream,int error)

{
  long *plVar1;
  long lVar2;
  undefined8 *puVar3;
  
  while (plVar1 = (long *)stream->write_queue[0], stream->write_queue != (void **)plVar1) {
    lVar2 = *plVar1;
    *(long *)plVar1[1] = lVar2;
    *(long *)(lVar2 + 8) = plVar1[1];
    *(int *)((long)plVar1 + 0x24) = error;
    *plVar1 = (long)stream->write_completed_queue;
    puVar3 = (undefined8 *)stream->write_completed_queue[1];
    plVar1[1] = (long)puVar3;
    *puVar3 = plVar1;
    stream->write_completed_queue[1] = plVar1;
  }
  return;
}

Assistant:

void uv__stream_flush_write_queue(uv_stream_t* stream, int error) {
  uv_write_t* req;
  QUEUE* q;
  while (!QUEUE_EMPTY(&stream->write_queue)) {
    q = QUEUE_HEAD(&stream->write_queue);
    QUEUE_REMOVE(q);

    req = QUEUE_DATA(q, uv_write_t, queue);
    req->error = error;

    QUEUE_INSERT_TAIL(&stream->write_completed_queue, &req->queue);
  }
}